

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O2

char testinator::detail::Arbitrary_Arithmetic_IntCast<signed_char>::generate
               (size_t generation,unsigned_long randomSeed)

{
  result_type_conflict rVar1;
  TestRegistry *pTVar2;
  uniform_int_distribution<int> dis;
  param_type local_18;
  
  if (generation < 3) {
    return (char)(0x7f8000 >> ((byte)((int)generation << 3) & 0x1f));
  }
  pTVar2 = TestRegistry::Instance();
  ::std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&pTVar2->m_generator,randomSeed);
  local_18._M_a = -0x7f;
  local_18._M_b = 0x7e;
  rVar1 = ::std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_18,&pTVar2->m_generator);
  return (char)rVar1;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_int_distribution<int> dis(
                std::numeric_limits<T>::min() + 1, std::numeric_limits<T>::max() - 1);
            return static_cast<T>(dis(gen));
          }
        }
      }